

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

Enum xatlas::AddMesh(Atlas *atlas,MeshDecl *meshDecl,uint32_t meshCountHint)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  Enum EVar4;
  float fVar5;
  code *pcVar6;
  uint32_t *puVar7;
  void *pvVar8;
  uint8_t *puVar9;
  uint uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  Atlas *pAVar13;
  char cVar14;
  TaskGroupHandle TVar15;
  undefined4 *puVar16;
  Mesh *this;
  undefined8 *puVar17;
  byte bVar18;
  float *pfVar19;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  Enum EVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  char *pcVar26;
  uint uVar27;
  float fVar28;
  float *pfVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  Task task;
  uint32_t tri [3];
  Vector2 texcoord;
  Vector3 local_78;
  float *local_68;
  Vector3 local_60;
  Atlas *local_50;
  Vector2 local_48;
  ulong local_40;
  long local_38;
  
  if (atlas == (Atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x220b,"AddMeshError::Enum xatlas::AddMesh(Atlas *, const MeshDecl &, uint32_t)")
    ;
  }
  if (*(int *)&atlas[4].field_0x14 == 0) {
    local_50 = atlas;
    if (*(Progress **)&atlas[1].atlasCount == (Progress *)0x0) {
      puVar16 = (undefined4 *)(*(code *)internal::s_realloc)(0,0x50);
      if (puVar16 == (undefined4 *)0x0) goto LAB_001a4820;
      pcVar6 = *(code **)&atlas[3].texelsPerUnit;
      puVar7 = atlas[3].image;
      *puVar16 = 0;
      *(undefined1 *)(puVar16 + 1) = 0;
      puVar16[2] = 0;
      *(code **)(puVar16 + 4) = pcVar6;
      *(uint32_t **)(puVar16 + 6) = puVar7;
      puVar16[8] = 1;
      *(undefined8 *)(puVar16 + 9) = 0;
      *(undefined8 *)(puVar16 + 0xb) = 0;
      *(undefined8 *)(puVar16 + 0xd) = 0;
      *(undefined8 *)(puVar16 + 0xf) = 0;
      *(undefined8 *)(puVar16 + 0x10) = 0;
      *(undefined8 *)(puVar16 + 0x12) = 0;
      if ((pcVar6 != (code *)0x0) && (cVar14 = (*pcVar6)(0,0), cVar14 == '\0')) {
        LOCK();
        *(undefined1 *)(puVar16 + 1) = 1;
        UNLOCK();
      }
      *(undefined4 **)&atlas[1].atlasCount = puVar16;
    }
    else {
      uVar22 = atlas[1].width + 1;
      if (uVar22 <= meshCountHint) {
        uVar22 = meshCountHint;
      }
      internal::Progress::setMaxValue(*(Progress **)&atlas[1].atlasCount,uVar22);
    }
    uVar22 = meshDecl->indexCount;
    uVar10 = meshDecl->vertexCount;
    if (uVar22 != 0) {
      uVar10 = uVar22;
    }
    uVar31 = (ulong)uVar10;
    if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == '\x01')) {
      (*(code *)internal::s_print)
                ("Adding mesh %d: %u vertices, %u triangles\n",local_50[1].width,
                 meshDecl->vertexCount,uVar31 / 3);
    }
    EVar20 = InvalidIndexCount;
    if (uVar10 * -0x55555555 < 0x55555556) {
      if (uVar10 != 0 && uVar22 != 0) {
        pvVar8 = meshDecl->indexData;
        if (pvVar8 == (void *)0x0) {
LAB_001a4728:
          __assert_fail("indexData",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x2203,
                        "uint32_t xatlas::DecodeIndex(IndexFormat::Enum, const void *, int32_t, uint32_t)"
                       );
        }
        uVar24 = 0;
        do {
          if (meshDecl->indexFormat == UInt16) {
            uVar27 = (uint)(ushort)(*(short *)((long)pvVar8 + uVar24 * 2) +
                                   (short)meshDecl->indexOffset);
          }
          else {
            uVar27 = *(int *)((long)pvVar8 + uVar24 * 4) + meshDecl->indexOffset;
          }
          if (meshDecl->vertexCount <= uVar27) {
            return IndexOutOfRange;
          }
          uVar24 = uVar24 + 1;
        } while (uVar31 != uVar24);
      }
      pvVar8 = meshDecl->vertexNormalData;
      this = (Mesh *)(*(code *)internal::s_realloc)(0,0x1c0);
      if (this != (Mesh *)0x0) {
        internal::Mesh::Mesh
                  (this,meshDecl->epsilon,meshDecl->vertexCount,uVar10 / 3,
                   (uint)(pvVar8 != (void *)0x0) * 4 + 3,local_50[1].width);
        if (meshDecl->vertexCount != 0) {
          uVar27 = 0;
          do {
            local_60.x = 0.0;
            local_60.y = 0.0;
            local_60.z = 0.0;
            local_48.x = 0.0;
            local_48.y = 0.0;
            pvVar8 = meshDecl->vertexNormalData;
            if (pvVar8 != (void *)0x0) {
              if (meshDecl->vertexNormalStride == 0) {
                __assert_fail("meshDecl.vertexNormalStride > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                              ,0x21f6,
                              "internal::Vector3 xatlas::DecodeNormal(const MeshDecl &, uint32_t)");
              }
              uVar24 = (ulong)(meshDecl->vertexNormalStride * uVar27);
              local_60._0_8_ = *(ulong *)((long)pvVar8 + uVar24);
              local_60.z = *(float *)((long)pvVar8 + uVar24 + 8);
            }
            if (meshDecl->vertexUvData != (void *)0x0) {
              if (meshDecl->vertexUvStride == 0) {
                __assert_fail("meshDecl.vertexUvStride > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                              ,0x21fd,
                              "internal::Vector2 xatlas::DecodeUv(const MeshDecl &, uint32_t)");
              }
              local_48 = *(Vector2 *)
                          ((long)meshDecl->vertexUvData + (ulong)(meshDecl->vertexUvStride * uVar27)
                          );
            }
            pvVar8 = meshDecl->vertexPositionData;
            if (pvVar8 == (void *)0x0) {
              __assert_fail("meshDecl.vertexPositionData",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                            ,0x21ee,
                            "internal::Vector3 xatlas::DecodePosition(const MeshDecl &, uint32_t)");
            }
            if (meshDecl->vertexPositionStride == 0) {
              __assert_fail("meshDecl.vertexPositionStride > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                            ,0x21ef,
                            "internal::Vector3 xatlas::DecodePosition(const MeshDecl &, uint32_t)");
            }
            uVar24 = (ulong)(meshDecl->vertexPositionStride * uVar27);
            local_78._0_8_ = *(ulong *)((long)pvVar8 + uVar24);
            local_78.z = *(float *)((long)pvVar8 + uVar24 + 8);
            internal::Mesh::addVertex(this,&local_78,&local_60,&local_48);
            uVar27 = uVar27 + 1;
          } while (uVar27 < meshDecl->vertexCount);
        }
        if (2 < uVar10) {
          local_40 = uVar31 / 3;
          lVar23 = 0;
          uVar31 = 0;
          do {
            pvVar8 = meshDecl->indexData;
            iVar21 = meshDecl->indexOffset;
            EVar4 = meshDecl->indexFormat;
            local_38 = lVar23;
            lVar25 = 0;
            do {
              if (uVar22 == 0) {
                fVar28 = (float)lVar23;
              }
              else {
                if (pvVar8 == (void *)0x0) goto LAB_001a4728;
                if (EVar4 == UInt16) {
                  fVar28 = (float)(uint)(ushort)(*(short *)((long)pvVar8 + lVar23 * 2) +
                                                (short)iVar21);
                }
                else {
                  fVar28 = (float)(*(int *)((long)pvVar8 + lVar23 * 4) + iVar21);
                }
              }
              (&local_78.x)[lVar25] = fVar28;
              lVar25 = lVar25 + 1;
              lVar23 = lVar23 + 1;
            } while (lVar25 != 3);
            pfVar19 = (float *)0x0;
            lVar23 = 0;
            do {
              if (lVar23 == 3) break;
              fVar28 = (&local_78.x)[lVar23];
              uVar24 = (ulong)(uint)fVar28;
              lVar25 = 0;
              if (lVar23 != 2) {
                lVar25 = lVar23 + 1;
              }
              fVar5 = (&local_78.x)[lVar25];
              uVar30 = (ulong)(uint)fVar5;
              if (fVar28 == fVar5) {
                pfVar19 = (float *)CONCAT71((int7)((ulong)pfVar19 >> 8),1);
                if ((internal::s_print == (undefined *)0x0) || (internal::s_printVerbose != '\x01'))
                {
LAB_001a41bd:
                  bVar32 = false;
                }
                else {
                  bVar32 = false;
                  (*(code *)internal::s_print)
                            ("   Degenerate edge: index %d, index %d\n",uVar24,uVar30);
                  pfVar19 = (float *)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
                }
              }
              else {
                fVar3 = (float)(this->m_positions).m_base.size;
                if (((uint)fVar3 <= (uint)fVar28) || ((uint)fVar3 <= (uint)fVar5))
                goto LAB_001a4709;
                puVar9 = (this->m_positions).m_base.buffer;
                pfVar1 = (float *)(puVar9 + uVar24 * 0xc);
                fVar28 = (*(float *)(puVar9 + uVar30 * 0xc + 8) - pfVar1[2]) *
                         (*(float *)(puVar9 + uVar30 * 0xc + 8) - pfVar1[2]) +
                         (*(float *)(puVar9 + uVar30 * 0xc) - *pfVar1) *
                         (*(float *)(puVar9 + uVar30 * 0xc) - *pfVar1) +
                         (*(float *)(puVar9 + uVar30 * 0xc + 4) - pfVar1[1]) *
                         (*(float *)(puVar9 + uVar30 * 0xc + 4) - pfVar1[1]);
                if (fVar28 < 0.0) {
                  local_68 = pfVar19;
                  fVar28 = sqrtf(fVar28);
                  pfVar19 = local_68;
                }
                else {
                  fVar28 = SQRT(fVar28);
                }
                bVar32 = 0.0 < fVar28;
                if (!bVar32) {
                  pfVar19 = (float *)CONCAT71((int7)((ulong)pfVar19 >> 8),1);
                  if ((internal::s_print != (undefined *)0x0) &&
                     (internal::s_printVerbose == '\x01')) {
                    pfVar19 = (float *)(puVar9 + uVar30 * 0xc);
                    (*(code *)internal::s_print)
                              (SUB84((double)*pfVar1,0),(double)pfVar1[1],(double)pfVar1[2],
                               (double)*pfVar19,(double)pfVar19[1],(double)pfVar19[2],
                               "   Zero length edge: index %d position (%g %g %g), index %d position (%g %g %g)\n"
                               ,uVar24,uVar30);
                    pfVar19 = (float *)CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
                  }
                  goto LAB_001a41bd;
                }
              }
              lVar23 = lVar23 + 1;
            } while (bVar32);
            if (((ulong)pfVar19 & 1) == 0) {
              uVar24 = 0;
              do {
                fVar28 = (&local_78.x)[uVar24];
                uVar30 = (ulong)(uint)fVar28;
                if ((this->m_positions).m_base.size <= (uint)fVar28) goto LAB_001a4709;
                puVar9 = (this->m_positions).m_base.buffer;
                if (((NAN(*(float *)(puVar9 + uVar30 * 0xc))) ||
                    (NAN(*(float *)(puVar9 + uVar30 * 0xc + 4)))) ||
                   (NAN(*(float *)(puVar9 + uVar30 * 0xc + 8)))) {
                  if ((internal::s_print != (undefined *)0x0) &&
                     (internal::s_printVerbose == '\x01')) {
                    pcVar26 = "   NAN position in face: %d\n";
LAB_001a4459:
                    (*(code *)internal::s_print)(pcVar26,uVar31);
                  }
LAB_001a4462:
                  iVar21 = 0x11;
                  pfVar19 = (float *)0x1;
                }
                else if (meshDecl->vertexNormalData == (void *)0x0) {
LAB_001a4370:
                  iVar21 = 0;
                  if (meshDecl->vertexUvData != (void *)0x0) {
                    if ((this->m_texcoords).m_base.size <= (uint)fVar28) {
                      __assert_fail("index < m_base.size",
                                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                                    ,0x4ae,
                                    "T &xatlas::internal::Array<xatlas::internal::Vector2>::operator[](uint32_t) [T = xatlas::internal::Vector2]"
                                   );
                    }
                    puVar9 = (this->m_texcoords).m_base.buffer;
                    if ((NAN(*(float *)(puVar9 + uVar30 * 8))) ||
                       (iVar21 = 0, NAN(*(float *)(puVar9 + uVar30 * 8 + 4)))) {
                      if ((internal::s_print != (undefined *)0x0) &&
                         (internal::s_printVerbose == '\x01')) {
                        pcVar26 = "   NAN texture coordinate in face: %d\n";
                        goto LAB_001a4459;
                      }
                      goto LAB_001a4462;
                    }
                  }
                }
                else {
                  if ((this->m_flags & 4) == 0) {
                    __assert_fail("m_flags & MeshFlags::HasNormals",
                                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                                  ,0xba4,
                                  "const Vector3 &xatlas::internal::Mesh::normal(uint32_t) const");
                  }
                  if ((this->m_normals).m_base.size <= (uint)fVar28) goto LAB_001a4709;
                  puVar9 = (this->m_normals).m_base.buffer;
                  if (((NAN(*(float *)(puVar9 + uVar30 * 0xc))) ||
                      (NAN(*(float *)(puVar9 + uVar30 * 0xc + 4)))) ||
                     (NAN(*(float *)(puVar9 + uVar30 * 0xc + 8)))) {
                    iVar21 = 0x11;
                    if ((internal::s_print != (undefined *)0x0) &&
                       (internal::s_printVerbose == '\x01')) {
                      (*(code *)internal::s_print)("   NAN normal in face: %d\n",uVar31);
                    }
                    bVar32 = false;
                    pfVar19 = (float *)0x1;
                  }
                  else {
                    iVar21 = 0;
                    bVar32 = true;
                  }
                  if (bVar32) goto LAB_001a4370;
                }
              } while ((iVar21 == 0) && (bVar32 = uVar24 < 2, uVar24 = uVar24 + 1, bVar32));
            }
            fVar5 = local_78.z;
            uVar11 = local_78._0_8_;
            fVar28 = (float)(this->m_positions).m_base.size;
            if ((uint)fVar28 <= (uint)local_78.x) {
LAB_001a4709:
              __assert_fail("index < m_base.size",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                            ,0x4a8,
                            "const T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) const [T = xatlas::internal::Vector3]"
                           );
            }
            fVar3 = local_78.y;
            if (((uint)fVar28 <= (uint)local_78.y) || ((uint)fVar28 <= (uint)local_78.z))
            goto LAB_001a4709;
            puVar9 = (this->m_positions).m_base.buffer;
            pfVar1 = (float *)(puVar9 + (local_78._0_8_ & 0xffffffff) * 0xc);
            pfVar29 = (float *)(puVar9 + (ulong)(uint)local_78.y * 0xc);
            pfVar2 = (float *)(puVar9 + (ulong)(uint)local_78.z * 0xc);
            fVar28 = 0.0;
            if (((ulong)pfVar19 & 1) == 0) {
              fVar33 = *pfVar29 - *pfVar1;
              fVar35 = pfVar29[1] - pfVar1[1];
              fVar34 = pfVar29[2] - pfVar1[2];
              fVar38 = *pfVar2 - *pfVar1;
              fVar28 = pfVar2[1] - pfVar1[1];
              fVar37 = pfVar2[2] - pfVar1[2];
              fVar36 = fVar35 * fVar37 - fVar28 * fVar34;
              fVar34 = fVar34 * fVar38 - fVar37 * fVar33;
              fVar28 = fVar28 * fVar33 - fVar38 * fVar35;
              fVar28 = fVar28 * fVar28 + fVar36 * fVar36 + fVar34 * fVar34;
              if (fVar28 < 0.0) {
                local_68 = pfVar29;
                fVar28 = sqrtf(fVar28);
                pfVar29 = local_68;
              }
              else {
                fVar28 = SQRT(fVar28);
              }
              fVar28 = fVar28 * 0.5;
              if (((fVar28 <= 1.1920929e-07) &&
                  (pfVar19 = (float *)0x1, internal::s_print != (undefined *)0x0)) &&
                 (internal::s_printVerbose == '\x01')) {
                local_68 = (float *)CONCAT44(local_68._4_4_,fVar28);
                (*(code *)internal::s_print)
                          (SUB84((double)fVar28,0),
                           "   Zero area face: %d, indices (%d %d %d), area is %f\n",uVar31,
                           uVar11 & 0xffffffff,fVar3,fVar5);
                pfVar19 = (float *)0x1;
                fVar28 = local_68._0_4_;
              }
            }
            bVar18 = (byte)pfVar19;
            if (((ulong)pfVar19 & 1) == 0) {
              fVar3 = meshDecl->epsilon;
              if ((((((ABS(*pfVar1 - *pfVar29) <= fVar3) && (ABS(pfVar1[1] - pfVar29[1]) <= fVar3))
                    && (ABS(pfVar1[2] - pfVar29[2]) <= fVar3)) ||
                   (((ABS(*pfVar1 - *pfVar2) <= fVar3 && (ABS(pfVar1[1] - pfVar2[1]) <= fVar3)) &&
                    (ABS(pfVar1[2] - pfVar2[2]) <= fVar3)))) ||
                  (((ABS(*pfVar29 - *pfVar2) <= fVar3 && (ABS(pfVar29[1] - pfVar2[1]) <= fVar3)) &&
                   (ABS(pfVar29[2] - pfVar2[2]) <= fVar3)))) &&
                 ((bVar18 = 1, internal::s_print != (undefined *)0x0 &&
                  (internal::s_printVerbose == '\x01')))) {
                (*(code *)internal::s_print)
                          (SUB84((double)fVar28,0),"   Degenerate face: %d, area is %f\n",uVar31);
                bVar18 = 1;
              }
            }
            uVar12 = local_78._0_8_;
            if ((meshDecl->faceIgnoreData != (bool *)0x0) &&
               (meshDecl->faceIgnoreData[uVar31] != false)) {
              bVar18 = 1;
            }
            local_78.x = (float)uVar11;
            local_78.y = SUB84(uVar11,4);
            local_60.x = local_78.x;
            local_60.y = local_78.y;
            local_60.z = fVar5;
            local_78._0_8_ = uVar12;
            internal::Mesh::addFace(this,(uint32_t *)&local_60,(bool)(bVar18 & 1),true);
            uVar31 = uVar31 + 1;
            lVar23 = local_38 + 3;
          } while (uVar31 != local_40);
        }
        pAVar13 = local_50;
        if (local_50[1].meshCount == 0xffffffff) {
          TVar15 = internal::TaskScheduler::createTaskGroup(*(TaskScheduler **)(local_50 + 4),0);
          pAVar13[1].meshCount = TVar15.value;
        }
        puVar17 = (undefined8 *)(*(code *)internal::s_realloc)(0,0x10);
        if (puVar17 != (undefined8 *)0x0) {
          *puVar17 = 0;
          puVar17[1] = 0;
          *puVar17 = pAVar13;
          puVar17[1] = this;
          task.userData = puVar17;
          task.func = runAddMeshTask;
          internal::TaskScheduler::run
                    (*(TaskScheduler **)(pAVar13 + 4),(TaskGroupHandle)pAVar13[1].meshCount,task);
          pAVar13[1].width = pAVar13[1].width + 1;
          return Success;
        }
      }
LAB_001a4820:
      __assert_fail("mem",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                    ,0x154,"void *xatlas::internal::Realloc(void *, size_t, int, const char *, int)"
                   );
    }
  }
  else {
    EVar20 = Error;
    if (internal::s_print != (undefined *)0x0) {
      (*(code *)internal::s_print)
                ("AddMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
    }
  }
  return EVar20;
}

Assistant:

AddMeshError::Enum AddMesh(Atlas *atlas, const MeshDecl &meshDecl, uint32_t meshCountHint)
{
	XA_DEBUG_ASSERT(atlas);
	if (!atlas) {
		XA_PRINT_WARNING("AddMesh: atlas is null.\n");
		return AddMeshError::Error;
	}
	Context *ctx = (Context *)atlas;
	if (!ctx->uvMeshes.isEmpty()) {
		XA_PRINT_WARNING("AddMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
		return AddMeshError::Error;
	}
#if XA_PROFILE
	if (ctx->meshCount == 0)
		internal::s_profile.addMeshReal = clock();
#endif
	// Don't know how many times AddMesh will be called, so progress needs to adjusted each time.
	if (!ctx->addMeshProgress) {
		ctx->addMeshProgress = XA_NEW_ARGS(internal::MemTag::Default, internal::Progress, ProgressCategory::AddMesh, ctx->progressFunc, ctx->progressUserData, 1);
	}
	else {
		ctx->addMeshProgress->setMaxValue(internal::max(ctx->meshCount + 1, meshCountHint));
	}
	XA_PROFILE_START(addMeshCopyData)
	const bool hasIndices = meshDecl.indexCount > 0;
	const uint32_t indexCount = hasIndices ? meshDecl.indexCount : meshDecl.vertexCount;
	XA_PRINT("Adding mesh %d: %u vertices, %u triangles\n", ctx->meshCount, meshDecl.vertexCount, indexCount / 3);
	// Expecting triangle faces.
	if ((indexCount % 3) != 0)
		return AddMeshError::InvalidIndexCount;
	if (hasIndices) {
		// Check if any index is out of range.
		for (uint32_t i = 0; i < indexCount; i++) {
			const uint32_t index = DecodeIndex(meshDecl.indexFormat, meshDecl.indexData, meshDecl.indexOffset, i);
			if (index >= meshDecl.vertexCount)
				return AddMeshError::IndexOutOfRange;
		}
	}
	uint32_t meshFlags = internal::MeshFlags::HasFaceGroups | internal::MeshFlags::HasIgnoredFaces;
	if (meshDecl.vertexNormalData)
		meshFlags |= internal::MeshFlags::HasNormals;
	internal::Mesh *mesh = XA_NEW_ARGS(internal::MemTag::Mesh, internal::Mesh, meshDecl.epsilon, meshDecl.vertexCount, indexCount / 3, meshFlags, ctx->meshCount);
	for (uint32_t i = 0; i < meshDecl.vertexCount; i++) {
		internal::Vector3 normal(0.0f);
		internal::Vector2 texcoord(0.0f);
		if (meshDecl.vertexNormalData)
			normal = DecodeNormal(meshDecl, i);
		if (meshDecl.vertexUvData)
			texcoord = DecodeUv(meshDecl, i);
		mesh->addVertex(DecodePosition(meshDecl, i), normal, texcoord);
	}
	for (uint32_t i = 0; i < indexCount / 3; i++) {
		uint32_t tri[3];
		for (int j = 0; j < 3; j++)
			tri[j] = hasIndices ? DecodeIndex(meshDecl.indexFormat, meshDecl.indexData, meshDecl.indexOffset, i * 3 + j) : i * 3 + j;
		bool ignore = false;
		// Check for degenerate or zero length edges.
		for (int j = 0; j < 3; j++) {
			const uint32_t index1 = tri[j];
			const uint32_t index2 = tri[(j + 1) % 3];
			if (index1 == index2) {
				ignore = true;
				XA_PRINT("   Degenerate edge: index %d, index %d\n", index1, index2);
				break;
			}
			const internal::Vector3 &pos1 = mesh->position(index1);
			const internal::Vector3 &pos2 = mesh->position(index2);
			if (internal::length(pos2 - pos1) <= 0.0f) {
				ignore = true;
				XA_PRINT("   Zero length edge: index %d position (%g %g %g), index %d position (%g %g %g)\n", index1, pos1.x, pos1.y, pos1.z, index2, pos2.x, pos2.y, pos2.z);
				break;
			}
		}
		// Ignore faces with any nan vertex attributes.
		if (!ignore) {
			for (int j = 0; j < 3; j++) {
				const internal::Vector3 &pos = mesh->position(tri[j]);
				if (internal::isNan(pos.x) || internal::isNan(pos.y) || internal::isNan(pos.z)) {
					XA_PRINT("   NAN position in face: %d\n", i);
					ignore = true;
					break;
				}
				if (meshDecl.vertexNormalData) {
					const internal::Vector3 &normal = mesh->normal(tri[j]);
					if (internal::isNan(normal.x) || internal::isNan(normal.y) || internal::isNan(normal.z)) {
						XA_PRINT("   NAN normal in face: %d\n", i);
						ignore = true;
						break;
					}
				}
				if (meshDecl.vertexUvData) {
					const internal::Vector2 &uv = mesh->texcoord(tri[j]);
					if (internal::isNan(uv.x) || internal::isNan(uv.y)) {
						XA_PRINT("   NAN texture coordinate in face: %d\n", i);
						ignore = true;
						break;
					}
				}
			}
		}
		const internal::Vector3 &a = mesh->position(tri[0]);
		const internal::Vector3 &b = mesh->position(tri[1]);
		const internal::Vector3 &c = mesh->position(tri[2]);
		// Check for zero area faces.
		float area = 0.0f;
		if (!ignore) {
			area = internal::length(internal::cross(b - a, c - a)) * 0.5f;
			if (area <= internal::kAreaEpsilon) {
				ignore = true;
				XA_PRINT("   Zero area face: %d, indices (%d %d %d), area is %f\n", i, tri[0], tri[1], tri[2], area);
			}
		}
		if (!ignore) {
			if (internal::equal(a, b, meshDecl.epsilon) || internal::equal(a, c, meshDecl.epsilon) || internal::equal(b, c, meshDecl.epsilon)) {
				ignore = true;
				XA_PRINT("   Degenerate face: %d, area is %f\n", i, area);
			}
		}
		if (meshDecl.faceIgnoreData && meshDecl.faceIgnoreData[i])
			ignore = true;
		mesh->addFace(tri[0], tri[1], tri[2], ignore);
	}
	XA_PROFILE_END(addMeshCopyData)
	if (ctx->addMeshTaskGroup.value == UINT32_MAX)
		ctx->addMeshTaskGroup = ctx->taskScheduler->createTaskGroup();
	AddMeshTaskArgs *taskArgs = XA_NEW(internal::MemTag::Default, AddMeshTaskArgs); // The task frees this.
	taskArgs->ctx = ctx;
	taskArgs->mesh = mesh;
	internal::Task task;
	task.userData = taskArgs;
	task.func = runAddMeshTask;
	ctx->taskScheduler->run(ctx->addMeshTaskGroup, task);
	ctx->meshCount++;
	return AddMeshError::Success;
}